

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<MaterialDataV,_10>::~TPZManVector(TPZManVector<MaterialDataV,_10> *this)

{
  long *plVar1;
  MaterialDataV *pMVar2;
  double dVar3;
  long *plVar4;
  TPZManVector<double,_10> *this_00;
  long lVar5;
  
  (this->super_TPZVec<MaterialDataV>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019e0b30;
  if ((this->super_TPZVec<MaterialDataV>).fStore == this->fExtAlloc) {
    (this->super_TPZVec<MaterialDataV>).fStore = (MaterialDataV *)0x0;
  }
  (this->super_TPZVec<MaterialDataV>).fNAlloc = 0;
  this_00 = &this->fExtAlloc[9].fProperties.super_TPZManVector<double,_10>;
  lVar5 = -0x5f0;
  do {
    TPZManVector<double,_10>::~TPZManVector(this_00);
    if (this_00[-1].fExtAlloc + 8 != (double *)this_00[-1].fExtAlloc[6]) {
      operator_delete((long *)this_00[-1].fExtAlloc[6],(long)this_00[-1].fExtAlloc[8] + 1);
    }
    this_00 = (TPZManVector<double,_10> *)(this_00[-2].fExtAlloc + 5);
    lVar5 = lVar5 + 0x98;
  } while (lVar5 != 0);
  (this->super_TPZVec<MaterialDataV>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0b98;
  pMVar2 = (this->super_TPZVec<MaterialDataV>).fStore;
  if (pMVar2 != (MaterialDataV *)0x0) {
    dVar3 = pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc[9];
    if (dVar3 != 0.0) {
      lVar5 = (long)dVar3 * 0x98;
      do {
        TPZManVector<double,_10>::~TPZManVector
                  ((TPZManVector<double,_10> *)((long)pMVar2 + lVar5 + -0x70));
        plVar1 = (long *)((long)pMVar2 + lVar5 + -0x80);
        plVar4 = *(long **)((long)pMVar2 + lVar5 + -0x90);
        if (plVar1 != plVar4) {
          operator_delete(plVar4,*plVar1 + 1);
        }
        lVar5 = lVar5 + -0x98;
      } while (lVar5 != 0);
    }
    operator_delete__(pMVar2[-1].fProperties.super_TPZManVector<double,_10>.fExtAlloc + 9,
                      (long)dVar3 * 0x98 + 8);
    return;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}